

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

void __thiscall arm::RegisterOperand::display(RegisterOperand *this,ostream *o)

{
  display_reg_name(o,this->reg);
  if ((this->shift != Lsl) || (this->shift_amount != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
    display_shift(o,this->shift);
    if (this->shift != Rrx) {
      std::__ostream_insert<char,std::char_traits<char>>(o," #",2);
      std::ostream::_M_insert<unsigned_long>((ulong)o);
      return;
    }
  }
  return;
}

Assistant:

void RegisterOperand::display(std::ostream &o) const {
  display_reg_name(o, reg);
  if (shift != RegisterShiftKind::Lsl || shift_amount != 0) {
    o << ", ";
    display_shift(o, shift);
    if (shift != RegisterShiftKind::Rrx) {
      o << " #" << (unsigned int)shift_amount;
    }
  }
}